

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_service.cpp
# Opt level: O1

bool __thiscall
booster::aio::event_loop_impl::run_one(event_loop_impl *this,event *evs,size_t evs_size)

{
  _Head_base<0UL,_booster::aio::reactor_*,_false> this_00;
  _Map_pointer ppcVar1;
  _Elt_pointer pcVar2;
  const_iterator __position;
  _Base_ptr p_Var3;
  pollfd pVar4;
  undefined8 uVar5;
  int iVar6;
  native_type nVar7;
  int iVar8;
  uint uVar9;
  event *this_01;
  pollfd *ppVar10;
  io_data *piVar11;
  system_error *this_02;
  uint uVar12;
  fd_set *in_RCX;
  pthread_mutex_t *ppVar13;
  int extraout_EDX;
  int extraout_EDX_00;
  uint uVar14;
  uint uVar15;
  _Base_ptr p_Var16;
  fd_set *in_R8;
  timeval *in_R9;
  error_category *peVar17;
  pollfd *__fds;
  select_interrupter *psVar18;
  iterator evptr;
  ptime pVar19;
  error_code eVar20;
  completion_handler exec;
  error_code select_error;
  lock_guard l;
  byte local_c1;
  undefined1 local_c0 [12];
  undefined4 uStack_b4;
  error_category *peStack_b0;
  size_t local_a8;
  _func_void_completion_handler_ptr *local_a0;
  long local_98;
  pthread_mutex_t *local_90;
  error_category *local_88;
  deque<booster::aio::event_loop_impl::completion_handler,_std::allocator<booster::aio::event_loop_impl::completion_handler>_>
  *local_80;
  undefined1 local_78 [64];
  undefined1 local_38;
  
  local_90 = (pthread_mutex_t *)&this->data_mutex_;
  local_38 = 0;
  this_01 = evs;
  local_78._56_8_ = local_90;
  std::unique_lock<std::recursive_mutex>::lock
            ((unique_lock<std::recursive_mutex> *)(local_78 + 0x38));
  local_38 = 1;
  iVar6 = extraout_EDX;
  if ((this->reactor_)._M_t.
      super___uniq_ptr_impl<booster::aio::reactor,_std::default_delete<booster::aio::reactor>_>._M_t
      .super__Tuple_impl<0UL,_booster::aio::reactor_*,_std::default_delete<booster::aio::reactor>_>.
      super__Head_base<0UL,_booster::aio::reactor_*,_false>._M_head_impl == (reactor *)0x0) {
    this_01 = (event *)operator_new(8);
    reactor::reactor((reactor *)this_01,this->reactor_type_);
    std::__uniq_ptr_impl<booster::aio::reactor,_std::default_delete<booster::aio::reactor>_>::reset
              ((__uniq_ptr_impl<booster::aio::reactor,_std::default_delete<booster::aio::reactor>_>
                *)this,(pointer)this_01);
    iVar6 = extraout_EDX_00;
  }
  psVar18 = &this->interrupter_;
  iVar6 = impl::select_interrupter::open(psVar18,(char *)this_01,iVar6);
  if ((char)iVar6 != '\0') {
    this_00._M_head_impl =
         (this->reactor_)._M_t.
         super___uniq_ptr_impl<booster::aio::reactor,_std::default_delete<booster::aio::reactor>_>.
         _M_t.
         super__Tuple_impl<0UL,_booster::aio::reactor_*,_std::default_delete<booster::aio::reactor>_>
         .super__Head_base<0UL,_booster::aio::reactor_*,_false>._M_head_impl;
    nVar7 = impl::select_interrupter::get_fd(psVar18);
    reactor::select(this_00._M_head_impl,nVar7,(fd_set *)0x1,in_RCX,in_R8,in_R9);
  }
  local_80 = &this->dispatch_queue_;
  local_78._24_8_ = evs_size;
  local_78._32_8_ = psVar18;
  local_78._40_8_ = evs;
  if (this->stop_ == false) {
    ppcVar1 = (this->dispatch_queue_).
              super__Deque_base<booster::aio::event_loop_impl::completion_handler,_std::allocator<booster::aio::event_loop_impl::completion_handler>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node;
    iVar6 = (int)((ulong)((long)(this->dispatch_queue_).
                                super__Deque_base<booster::aio::event_loop_impl::completion_handler,_std::allocator<booster::aio::event_loop_impl::completion_handler>_>
                                ._M_impl.super__Deque_impl_data._M_start._M_last -
                         (long)(this->dispatch_queue_).
                               super__Deque_base<booster::aio::event_loop_impl::completion_handler,_std::allocator<booster::aio::event_loop_impl::completion_handler>_>
                               ._M_impl.super__Deque_impl_data._M_start._M_cur) >> 3) * -0x33333333
            + (int)((ulong)((long)(this->dispatch_queue_).
                                  super__Deque_base<booster::aio::event_loop_impl::completion_handler,_std::allocator<booster::aio::event_loop_impl::completion_handler>_>
                                  ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                           (long)(this->dispatch_queue_).
                                 super__Deque_base<booster::aio::event_loop_impl::completion_handler,_std::allocator<booster::aio::event_loop_impl::completion_handler>_>
                                 ._M_impl.super__Deque_impl_data._M_finish._M_first) >> 3) *
              -0x33333333 +
              ((int)((ulong)((long)ppcVar1 -
                            (long)(this->dispatch_queue_).
                                  super__Deque_base<booster::aio::event_loop_impl::completion_handler,_std::allocator<booster::aio::event_loop_impl::completion_handler>_>
                                  ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) + -1 +
              (uint)(ppcVar1 == (_Map_pointer)0x0)) * 0xc;
    do {
      pcVar2 = (this->dispatch_queue_).
               super__Deque_base<booster::aio::event_loop_impl::completion_handler,_std::allocator<booster::aio::event_loop_impl::completion_handler>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur;
      if (((this->dispatch_queue_).
           super__Deque_base<booster::aio::event_loop_impl::completion_handler,_std::allocator<booster::aio::event_loop_impl::completion_handler>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur == pcVar2) || (iVar6 < 1)) break;
      local_c0._0_8_ = (refcounted *)0x0;
      stack0xffffffffffffff48 =
           (error_category *)((ulong)stack0xffffffffffffff48 & 0xffffffff00000000);
      local_78._8_8_ = std::_V2::system_category();
      local_c0._0_8_ = (pcVar2->h).p_;
      (pcVar2->h).p_ = (refcounted *)0x0;
      local_78._0_8_ = stack0xffffffffffffff48;
      peVar17 = *(error_category **)&pcVar2->e;
      peStack_b0 = (pcVar2->e)._M_cat;
      *(error_category **)&pcVar2->e = stack0xffffffffffffff48;
      (pcVar2->e)._M_cat = (error_category *)local_78._8_8_;
      local_a8 = pcVar2->n;
      pcVar2->n = 0;
      local_a0 = pcVar2->type;
      pcVar2->type = completion_handler::op_none;
      unique0x10001064 = peVar17;
      std::
      deque<booster::aio::event_loop_impl::completion_handler,_std::allocator<booster::aio::event_loop_impl::completion_handler>_>
      ::pop_front(local_80);
      ppVar13 = local_90;
      pthread_mutex_unlock(local_90);
      (*local_a0)((completion_handler *)local_c0);
      iVar8 = pthread_mutex_lock(ppVar13);
      if (iVar8 != 0) {
        std::__throw_system_error(iVar8);
      }
      iVar6 = iVar6 + -1;
      intrusive_ptr<booster::refcounted>::~intrusive_ptr
                ((intrusive_ptr<booster::refcounted> *)local_c0);
    } while (this->stop_ == false);
  }
  pVar19 = ptime::now();
  local_98 = pVar19.sec;
  local_88 = (error_category *)CONCAT44(local_88._4_4_,pVar19.nsec);
  local_c1 = this->stop_;
  if ((bool)local_c1 == false) {
    if ((this->timer_events_)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      do {
        __position._M_node =
             (this->timer_events_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        if ((local_98 < *(long *)(__position._M_node + 1)) ||
           ((local_98 <= *(long *)(__position._M_node + 1) &&
            ((int)local_88 < *(int *)&__position._M_node[1]._M_parent)))) break;
        (this->timer_events_index_).
        super__Vector_base<std::_Rb_tree_iterator<std::pair<const_booster::ptime,_booster::aio::event_loop_impl::timer_event>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_booster::ptime,_booster::aio::event_loop_impl::timer_event>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[*(int *)&__position._M_node[1]._M_left]._M_node =
             &(this->timer_events_)._M_t._M_impl.super__Rb_tree_header._M_header;
        peStack_b0 = (error_category *)std::_V2::system_category();
        local_c0._0_8_ = __position._M_node[1]._M_right;
        __position._M_node[1]._M_right = (_Base_ptr)0x0;
        stack0xffffffffffffff48 =
             (error_category *)((ulong)stack0xffffffffffffff48 & 0xffffffff00000000);
        local_a8 = 0;
        local_a0 = completion_handler::op_event_handler;
        std::
        deque<booster::aio::event_loop_impl::completion_handler,_std::allocator<booster::aio::event_loop_impl::completion_handler>_>
        ::push_back(local_80,(value_type *)local_c0);
        std::
        _Rb_tree<booster::ptime,_std::pair<const_booster::ptime,_booster::aio::event_loop_impl::timer_event>,_std::_Select1st<std::pair<const_booster::ptime,_booster::aio::event_loop_impl::timer_event>_>,_std::less<booster::ptime>,_std::allocator<std::pair<const_booster::ptime,_booster::aio::event_loop_impl::timer_event>_>_>
        ::_M_erase_aux(&(this->timer_events_)._M_t,__position);
        intrusive_ptr<booster::refcounted>::~intrusive_ptr
                  ((intrusive_ptr<booster::refcounted> *)local_c0);
        local_c1 = this->stop_;
        if ((bool)local_c1 != false) goto LAB_00161dbf;
      } while ((this->timer_events_)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0);
    }
    if ((local_c1 & 1) == 0) {
      p_Var16 = ptime::zero;
      iVar6 = DAT_001d6908;
      if ((this->dispatch_queue_).
          super__Deque_base<booster::aio::event_loop_impl::completion_handler,_std::allocator<booster::aio::event_loop_impl::completion_handler>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          (this->dispatch_queue_).
          super__Deque_base<booster::aio::event_loop_impl::completion_handler,_std::allocator<booster::aio::event_loop_impl::completion_handler>_>
          ._M_impl.super__Deque_impl_data._M_start._M_cur) {
        local_c0._0_8_ = (_Base_ptr)0xe10;
        stack0xffffffffffffff48 =
             (error_category *)((ulong)stack0xffffffffffffff48 & 0xffffffff00000000);
        ptime::normalize((ptime *)local_c0);
        p_Var16 = (_Base_ptr)local_c0._0_8_;
        iVar6 = local_c0._8_4_;
      }
      __fds = (pollfd *)local_78._40_8_;
      psVar18 = (select_interrupter *)local_78._32_8_;
      if ((this->timer_events_)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
        p_Var3 = (this->timer_events_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        local_c0._0_8_ = *(long *)(p_Var3 + 1) - local_98;
        stack0xffffffffffffff48 =
             (error_category *)CONCAT44(uStack_b4,*(int *)&p_Var3[1]._M_parent - (int)local_88);
        ptime::normalize((ptime *)local_c0);
        if ((long)local_c0._0_8_ < (long)p_Var16 ||
            (int)local_c0._8_4_ < iVar6 && (long)local_c0._0_8_ <= (long)p_Var16) {
          p_Var16 = (_Base_ptr)local_c0._0_8_;
          iVar6 = local_c0._8_4_;
        }
      }
      local_c0._0_8_ = local_c0._0_8_ & 0xffffffff00000000;
      register0x00000000 = (error_category *)std::_V2::system_category();
      ppVar13 = local_90;
      this->polling_ = true;
      local_88 = register0x00000000;
      pthread_mutex_unlock(local_90);
      uVar5 = local_78._24_8_;
      iVar8 = (int)local_78._24_8_;
      local_78._48_8_ = this;
      uVar9 = reactor::poll((this->reactor_)._M_t.
                            super___uniq_ptr_impl<booster::aio::reactor,_std::default_delete<booster::aio::reactor>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_booster::aio::reactor_*,_std::default_delete<booster::aio::reactor>_>
                            .super__Head_base<0UL,_booster::aio::reactor_*,_false>._M_head_impl,
                            __fds,local_78._24_8_ & 0xffffffff,(int)p_Var16 * 1000 + iVar6 / 1000000
                           );
      iVar6 = pthread_mutex_lock(ppVar13);
      if (iVar6 != 0) {
        std::__throw_system_error(iVar6);
      }
      this->polling_ = false;
      if (((local_c0._0_8_ & 0xfffffffb) != 0) &&
         ((this->dispatch_queue_).
          super__Deque_base<booster::aio::event_loop_impl::completion_handler,_std::allocator<booster::aio::event_loop_impl::completion_handler>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          (this->dispatch_queue_).
          super__Deque_base<booster::aio::event_loop_impl::completion_handler,_std::allocator<booster::aio::event_loop_impl::completion_handler>_>
          ._M_impl.super__Deque_impl_data._M_start._M_cur)) {
        this_02 = (system_error *)__cxa_allocate_exception(0x40);
        eVar20._0_8_ = local_c0._0_8_ & 0xffffffff;
        eVar20._M_cat = stack0xffffffffffffff48;
        system::system_error::system_error(this_02,eVar20);
        __cxa_throw(this_02,&system::system_error::typeinfo,system::system_error::~system_error);
      }
      local_90 = (pthread_mutex_t *)(uVar5 & 0xffffffff);
      if ((int)uVar9 < iVar8) {
        local_90 = (pthread_mutex_t *)(ulong)uVar9;
      }
      ppVar10 = __fds;
      ppVar13 = local_90;
      if (1 < (int)local_90) {
        do {
          uVar9 = this->seed_ * 0x41c64e6d + 0x3039;
          this->seed_ = uVar9;
          uVar9 = (uVar9 >> 0x10 & 0x7fff) * (int)ppVar13 >> 0xf;
          pVar4 = *ppVar10;
          *ppVar10 = ppVar10[uVar9];
          ppVar10[uVar9] = pVar4;
          ppVar13 = (pthread_mutex_t *)((long)ppVar13 + -1);
          ppVar10 = ppVar10 + 1;
        } while (ppVar13 != (pthread_mutex_t *)0x0);
      }
      if (0 < (int)local_90) {
        local_78._24_8_ = &this->map_;
        ppVar13 = (pthread_mutex_t *)0x0;
        do {
          iVar6 = __fds[(long)ppVar13].fd;
          nVar7 = impl::select_interrupter::get_fd(psVar18);
          if (iVar6 == nVar7) {
            impl::select_interrupter::clean(psVar18);
          }
          else {
            piVar11 = socket_map<booster::aio::event_loop_impl::io_data>::operator[]
                                ((socket_map<booster::aio::event_loop_impl::io_data> *)
                                 local_78._24_8_,__fds[(long)ppVar13].fd);
            uVar9 = *(uint *)&__fds[(long)ppVar13].events;
            uVar15 = uVar9 & 4;
            peVar17 = aio_error_cat;
            if (uVar15 == 0) {
              peVar17 = local_88;
            }
            uVar12 = piVar11->current_event;
            if (uVar15 != 0) {
              uVar12 = 0;
            }
            uVar14 = uVar12 & 0xfffffffe;
            if ((uVar9 & 1) == 0) {
              uVar14 = uVar12;
            }
            uVar12 = uVar14 & 0xfffffffd;
            if ((uVar9 & 2) == 0) {
              uVar12 = uVar14;
            }
            local_78._0_8_ = local_78._0_8_ & 0xffffffff00000000;
            local_78._8_8_ = local_88;
            reactor::select((this->reactor_)._M_t.
                            super___uniq_ptr_impl<booster::aio::reactor,_std::default_delete<booster::aio::reactor>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_booster::aio::reactor_*,_std::default_delete<booster::aio::reactor>_>
                            .super__Head_base<0UL,_booster::aio::reactor_*,_false>._M_head_impl,
                            __fds[(long)ppVar13].fd,(fd_set *)(ulong)uVar12,(fd_set *)local_78,
                            (fd_set *)0x0,in_R9);
            uVar9 = uVar15 >> 1;
            if (local_78._0_4_ != 0) {
              uVar12 = 0;
              if (uVar15 == 0) {
                local_98 = CONCAT44(local_98._4_4_,local_78._4_4_);
                peVar17 = (error_category *)local_78._8_8_;
                uVar9 = local_78._0_4_;
                uVar12 = 0;
              }
            }
            piVar11->current_event = uVar12;
            if (((uVar12 & 1) == 0) &&
               ((piVar11->readable).call_ptr.p_ != (callable<void_(const_std::error_code_&)> *)0x0))
            {
              local_c0._0_8_ = (piVar11->readable).call_ptr.p_;
              (piVar11->readable).call_ptr.p_ = (callable<void_(const_std::error_code_&)> *)0x0;
              stack0xffffffffffffff48 = (error_category *)CONCAT44((undefined4)local_98,uVar9);
              local_a8 = 0;
              local_a0 = completion_handler::op_event_handler;
              peStack_b0 = peVar17;
              std::
              deque<booster::aio::event_loop_impl::completion_handler,_std::allocator<booster::aio::event_loop_impl::completion_handler>_>
              ::emplace_back<booster::aio::event_loop_impl::completion_handler>
                        (local_80,(completion_handler *)local_c0);
              intrusive_ptr<booster::refcounted>::~intrusive_ptr
                        ((intrusive_ptr<booster::refcounted> *)local_c0);
            }
            this = (event_loop_impl *)local_78._48_8_;
            __fds = (pollfd *)local_78._40_8_;
            psVar18 = (select_interrupter *)local_78._32_8_;
            if (((uVar12 & 2) == 0) &&
               ((piVar11->writeable).call_ptr.p_ != (callable<void_(const_std::error_code_&)> *)0x0)
               ) {
              local_c0._0_8_ = (piVar11->writeable).call_ptr.p_;
              (piVar11->writeable).call_ptr.p_ = (callable<void_(const_std::error_code_&)> *)0x0;
              stack0xffffffffffffff48 = (error_category *)CONCAT44((undefined4)local_98,uVar9);
              local_a8 = 0;
              local_a0 = completion_handler::op_event_handler;
              peStack_b0 = peVar17;
              std::
              deque<booster::aio::event_loop_impl::completion_handler,_std::allocator<booster::aio::event_loop_impl::completion_handler>_>
              ::emplace_back<booster::aio::event_loop_impl::completion_handler>
                        (local_80,(completion_handler *)local_c0);
              intrusive_ptr<booster::refcounted>::~intrusive_ptr
                        ((intrusive_ptr<booster::refcounted> *)local_c0);
              this = (event_loop_impl *)local_78._48_8_;
              __fds = (pollfd *)local_78._40_8_;
              psVar18 = (select_interrupter *)local_78._32_8_;
            }
          }
          ppVar13 = (pthread_mutex_t *)((long)&(ppVar13->__data).__lock + 1);
        } while (local_90 != ppVar13);
      }
      if (this->stop_ != false) {
        impl::select_interrupter::notify(psVar18);
      }
    }
  }
LAB_00161dbf:
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)(local_78 + 0x38));
  return (bool)(~local_c1 & 1);
}

Assistant:

bool run_one(reactor::event *evs,size_t evs_size)
	{
		lock_guard l(data_mutex_);
		if(!reactor_.get()) {
			reactor_.reset(new reactor(reactor_type_));
		}
		if(interrupter_.open()) {
			reactor_->select(interrupter_.get_fd(),reactor::in);
		}

		int counter = dispatch_queue_.size();
		while(!stop_ && !dispatch_queue_.empty() && counter > 0) {
			completion_handler exec;
			exec.swap(dispatch_queue_.front());
			dispatch_queue_.pop_front();
			
			data_mutex_.unlock();
			try {
				
				exec();
			}
			catch(...) {
				data_mutex_.lock();
				throw;
			}
			data_mutex_.lock();
			counter --;
		}

		ptime now = ptime::now();

		while(!stop_ && !timer_events_.empty() && timer_events_.begin()->first <= now) {
			timer_events_type::iterator evptr = timer_events_.begin();
			timer_events_index_[evptr->second.event_id] = timer_events_.end();
			completion_handler disp(evptr->second.h,system::error_code());
			dispatch_queue_.push_back(disp);
			timer_events_.erase(evptr);
		}


		//
		// Restart -- dispatch timed-out timers, we also need to read now - once again
		//

		if(stop_)
			return false;

		ptime wait_time = dispatch_queue_.empty() ? ptime::hours(1) : ptime::zero;

		if(!timer_events_.empty()) {
			ptime diff = timer_events_.begin()->first - now;
			if(diff < wait_time)
				wait_time = diff;
			assert(wait_time >= ptime::zero);
		}

		
		int n = 0;

		{
			system::error_code poll_error;
			polling_ = true;
			try {
				data_mutex_.unlock();
				n = reactor_->poll(evs,evs_size,int(ptime::milliseconds(wait_time)),poll_error);
			}
			catch(...) {
				data_mutex_.lock();
				polling_ = false;
				throw;
			}
			data_mutex_.lock();
			polling_ = false;
		
			//
			// We may get EBADF, so if we do not handle it we may loop
			// forever. However, maybe there is a handler that handles this
			// in dipatch queue (for example close was executed).
			// So let's try again
			//
			// But if it empty - no handlers, abort.
			//
			if(poll_error && poll_error.value()!=EINTR && dispatch_queue_.empty()) {
				throw system::system_error(poll_error);
			}

		}

		if( n > int(evs_size) )
			n=evs_size;
		randomize_events(evs,n);
		for(int i=0;i<n && i<int(evs_size);i++) {
			
			if(evs[i].fd == interrupter_.get_fd()) {
				interrupter_.clean();
				continue;
			}
			
			using booster::system::error_code;

			io_data &cont = map_[evs[i].fd];
			
			int new_events = cont.current_event;

			error_code dispatch_error;

			if(evs[i].events & reactor::err) {
				dispatch_error = error_code(aio_error::select_failed,aio_error_cat);
				new_events = 0;
			}
			if(evs[i].events & reactor::in)
				new_events &= ~reactor::in;
			if(evs[i].events & reactor::out)
				new_events &= ~reactor::out;
			
			error_code select_error;
			reactor_->select(evs[i].fd,new_events,select_error);
			if(select_error) {
				new_events = 0;
				if(!dispatch_error)
					dispatch_error=select_error;
			}
			
			cont.current_event = new_events;

			if(cont.readable && (new_events & reactor::in) == 0) {
				dispatch_queue_.push_back(completion_handler(cont.readable,dispatch_error));
			}
			if(cont.writeable && (new_events & reactor::out) == 0) {
				dispatch_queue_.push_back(completion_handler(cont.writeable,dispatch_error));
			}
			
			if(new_events == 0)
				map_.erase(evs[i].fd);
		}

		if(stop_) {
			wake();
		}

		return true;

	}